

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void refresh_fc_eg_slot(FM_OPN *OPN,FM_SLOT *SLOT,int fc,int kc)

{
  uint uVar1;
  UINT8 UVar2;
  int iVar3;
  uint uVar4;
  UINT8 UVar5;
  
  iVar3 = fc + SLOT->DT[(uint)kc];
  if (iVar3 < 0) {
    iVar3 = iVar3 + OPN->fn_max;
  }
  SLOT->Incr = iVar3 * SLOT->mul >> 1;
  uVar1 = (uint)kc >> (SLOT->KSR & 0x1f);
  if (uVar1 != SLOT->ksr) {
    SLOT->ksr = (UINT8)uVar1;
    uVar1 = uVar1 & 0xff;
    uVar4 = SLOT->ar + uVar1;
    if (uVar4 < 0x5e) {
      UVar2 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
              [uVar4];
      UVar5 = eg_rate_select[uVar4];
    }
    else {
      UVar5 = 0x90;
      UVar2 = '\0';
    }
    SLOT->eg_sh_ar = UVar2;
    SLOT->eg_sel_ar = UVar5;
    uVar4 = SLOT->d1r + uVar1;
    SLOT->eg_sh_d1r =
         "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
         [uVar4];
    SLOT->eg_sel_d1r = eg_rate_select[uVar4];
    uVar4 = SLOT->d2r + uVar1;
    SLOT->eg_sh_d2r =
         "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
         [uVar4];
    SLOT->eg_sel_d2r = eg_rate_select[uVar4];
    uVar1 = uVar1 + SLOT->rr;
    SLOT->eg_sh_rr =
         "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
         [uVar1];
    SLOT->eg_sel_rr = eg_rate_select[uVar1];
  }
  return;
}

Assistant:

INLINE void refresh_fc_eg_slot(FM_OPN *OPN, FM_SLOT *SLOT , int fc , int kc )
{
	/* add detune value */
	fc += SLOT->DT[kc];

	/* detects frequency overflow (credits to Nemesis) */
	if (fc < 0) fc += OPN->fn_max;

	/* (frequency) phase increment counter */
	SLOT->Incr = (fc * SLOT->mul) >> 1;

	/* ksr */
	kc = kc >> SLOT->KSR;

	if( SLOT->ksr != kc )
	{
		SLOT->ksr = kc;

		/* recalculate envelope generator rates */
		if ((SLOT->ar + SLOT->ksr) < (32+62))
		{
			SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar  + SLOT->ksr ];
			SLOT->eg_sel_ar = eg_rate_select[SLOT->ar  + SLOT->ksr ];
		}
		else
		{
			/* verified by Nemesis on real hardware (Attack phase is blocked) */
			SLOT->eg_sh_ar  = 0;
			SLOT->eg_sel_ar = 18*RATE_STEPS;
		}

		SLOT->eg_sh_d1r = eg_rate_shift [SLOT->d1r + SLOT->ksr];
		SLOT->eg_sel_d1r= eg_rate_select[SLOT->d1r + SLOT->ksr];

		SLOT->eg_sh_d2r = eg_rate_shift [SLOT->d2r + SLOT->ksr];
		SLOT->eg_sel_d2r= eg_rate_select[SLOT->d2r + SLOT->ksr];

		SLOT->eg_sh_rr  = eg_rate_shift [SLOT->rr  + SLOT->ksr];
		SLOT->eg_sel_rr = eg_rate_select[SLOT->rr  + SLOT->ksr];

	}
}